

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void load_GL_NV_memory_attachment(GLADloadproc load)

{
  if (GLAD_GL_NV_memory_attachment != 0) {
    glad_glGetMemoryObjectDetachedResourcesuivNV =
         (PFNGLGETMEMORYOBJECTDETACHEDRESOURCESUIVNVPROC)
         (*load)("glGetMemoryObjectDetachedResourcesuivNV");
    glad_glResetMemoryObjectParameterNV =
         (PFNGLRESETMEMORYOBJECTPARAMETERNVPROC)(*load)("glResetMemoryObjectParameterNV");
    glad_glTexAttachMemoryNV = (PFNGLTEXATTACHMEMORYNVPROC)(*load)("glTexAttachMemoryNV");
    glad_glBufferAttachMemoryNV = (PFNGLBUFFERATTACHMEMORYNVPROC)(*load)("glBufferAttachMemoryNV");
    glad_glTextureAttachMemoryNV =
         (PFNGLTEXTUREATTACHMEMORYNVPROC)(*load)("glTextureAttachMemoryNV");
    glad_glNamedBufferAttachMemoryNV =
         (PFNGLNAMEDBUFFERATTACHMEMORYNVPROC)(*load)("glNamedBufferAttachMemoryNV");
  }
  return;
}

Assistant:

static void load_GL_NV_memory_attachment(GLADloadproc load) {
	if(!GLAD_GL_NV_memory_attachment) return;
	glad_glGetMemoryObjectDetachedResourcesuivNV = (PFNGLGETMEMORYOBJECTDETACHEDRESOURCESUIVNVPROC)load("glGetMemoryObjectDetachedResourcesuivNV");
	glad_glResetMemoryObjectParameterNV = (PFNGLRESETMEMORYOBJECTPARAMETERNVPROC)load("glResetMemoryObjectParameterNV");
	glad_glTexAttachMemoryNV = (PFNGLTEXATTACHMEMORYNVPROC)load("glTexAttachMemoryNV");
	glad_glBufferAttachMemoryNV = (PFNGLBUFFERATTACHMEMORYNVPROC)load("glBufferAttachMemoryNV");
	glad_glTextureAttachMemoryNV = (PFNGLTEXTUREATTACHMEMORYNVPROC)load("glTextureAttachMemoryNV");
	glad_glNamedBufferAttachMemoryNV = (PFNGLNAMEDBUFFERATTACHMEMORYNVPROC)load("glNamedBufferAttachMemoryNV");
}